

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O0

void logDouble<double>(void)

{
  Severity SVar1;
  SessionWriter *pSVar2;
  data_ref pacVar3;
  uint64_t _binlog_sid_v;
  double f;
  memory_order __b;
  memory_order __b_1;
  EventSource *in_stack_fffffffffffffe40;
  __pthread_internal_list *clock;
  atomic<unsigned_long> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  EventSource *eventSource;
  Session *this;
  undefined1 local_11a;
  cx_string<1UL> local_119;
  allocator local_117;
  allocator local_116;
  allocator local_115 [20];
  allocator local_101;
  undefined8 local_100;
  undefined2 local_f8;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  undefined8 local_90;
  string local_88 [32];
  undefined1 local_68 [72];
  __pthread_internal_list *local_20;
  memory_order local_18;
  int local_14;
  __pthread_internal_list *local_10;
  atomic<unsigned_long> *local_8;
  
  local_68._40_8_ = (pointer)0x4132d53a05ff20dd;
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x10844d);
  if (SVar1 < 0x81) {
    local_68._64_8_ = &logDouble<double>::_binlog_sid;
    local_68._60_4_ = 0;
    local_68._56_4_ = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_68._48_8_ = logDouble<double>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_68._32_8_ = logDouble<double>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (logDouble<double>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_100 = 0;
      local_f8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"main",&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"logDouble",local_115);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_116);
      local_90 = 0x1c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"{}",&local_117);
      this = (Session *)local_68;
      local_119 = binlog::detail::concatenated_tags<char_const(&)[3],double&>
                            ((char (*) [3])in_stack_fffffffffffffe48,
                             (double *)in_stack_fffffffffffffe40);
      pacVar3 = mserialize::cx_string<1UL>::data(&local_119);
      eventSource = (EventSource *)&local_11a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,*pacVar3,(allocator *)eventSource);
      local_68._32_8_ = binlog::Session::addEventSource(this,eventSource);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffe40);
      std::allocator<char>::~allocator((allocator<char> *)&local_11a);
      std::allocator<char>::~allocator((allocator<char> *)&local_117);
      std::allocator<char>::~allocator((allocator<char> *)&local_116);
      std::allocator<char>::~allocator((allocator<char> *)local_115);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      local_8 = &logDouble<double>::_binlog_sid;
      local_10 = (__pthread_internal_list *)local_68._32_8_;
      local_14 = 5;
      in_stack_fffffffffffffe48 = &logDouble<double>::_binlog_sid;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10;
      in_stack_fffffffffffffe54 = local_14;
      if (local_14 == 3) {
        (in_stack_fffffffffffffe48->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_10;
      }
      else if (local_14 == 5) {
        LOCK();
        (in_stack_fffffffffffffe48->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_10;
        UNLOCK();
      }
      else {
        (in_stack_fffffffffffffe48->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_10;
      }
    }
    pSVar2 = binlog::default_thread_local_writer();
    clock = (__pthread_internal_list *)local_68._32_8_;
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],double&>
              ((SessionWriter *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (uint64_t)in_stack_fffffffffffffe48,(uint64_t)clock,(char (*) [3])pSVar2,
               (double *)0x1089bf);
  }
  return;
}

Assistant:

void logDouble()
{
  T f = 1234234.0234242;
  BINLOG_INFO("{}", f);
}